

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int wait_ms(int timeout_ms)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint *puVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  timeval tVar7;
  timeval tVar8;
  
  if (timeout_ms == 0) {
    return 0;
  }
  if (timeout_ms < 0) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    iVar6 = -1;
  }
  else {
    tVar7 = tvnow();
    iVar6 = timeout_ms;
    do {
      iVar2 = poll((pollfd *)0x0,0,iVar6);
      if (iVar2 != -1) break;
      puVar3 = (uint *)__errno_location();
      if ((*puVar3 & 0xfffffffb) != 0) break;
      tVar8 = tvnow();
      lVar4 = tVar8.tv_sec - tVar7.tv_sec;
      iVar6 = 1;
      if ((lVar4 < 0x20c49ba5e353f7) && (iVar6 = 0, -0x20c49ba5e353f7 < lVar4)) {
        auVar1 = SEXT816(tVar8.tv_usec - tVar7.tv_usec) * SEXT816(-0x20c49ba5e353f7cf);
        iVar6 = ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) + (int)lVar4 * -1000;
      }
      iVar6 = iVar6 + timeout_ms;
    } while (0 < iVar6);
    iVar6 = -(uint)(iVar2 != 0);
  }
  return iVar6;
}

Assistant:

int wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    errno = EINVAL;
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = tvnow();
  do {
    int error;
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = errno;
    if(error && (error != EINTR))
      break;
    pending_ms = timeout_ms - (int)timediff(tvnow(), initial_tv);
    if(pending_ms <= 0)
      break;
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}